

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *sub,AppFormatMode mode)

{
  size_t sVar1;
  ostream *poVar2;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  App::get_display_name_abi_cxx11_(&local_1f8,sub,true);
  poVar2 = ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::operator<<(poVar2,'\n');
  ::std::__cxx11::string::~string((string *)&local_1f8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[9])(&local_1f8,this,sub);
  sVar1 = (this->super_FormatterBase).description_paragraph_width_;
  ::std::__cxx11::string::string((string *)&local_1d8,"  ",&local_1f9);
  detail::streamOutAsParagraph(local_1a8,&local_1f8,sVar1,&local_1d8,false);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  if (((sub->name_)._M_string_length == 0) &&
     ((sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (sub->aliases_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    detail::format_aliases(local_1a8,&sub->aliases_,(this->super_FormatterBase).column_width_ + 2);
  }
  (*(this->super_FormatterBase)._vptr_FormatterBase[4])(&local_1f8,this,sub);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  make_groups_abi_cxx11_(&local_1f8,this,sub,mode);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[5])(&local_1f8,this,sub,(ulong)mode);
  ::std::operator<<(local_1a8,(string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  (*(this->super_FormatterBase)._vptr_FormatterBase[8])(&local_1f8,this,sub);
  sVar1 = (this->super_FormatterBase).footer_paragraph_width_;
  ::std::__cxx11::string::string((string *)&local_1d8,"",&local_1f9);
  detail::streamOutAsParagraph(local_1a8,&local_1f8,sVar1,&local_1d8,false);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::operator<<(local_1a8,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_expanded(const App *sub, AppFormatMode mode) const {
    std::stringstream out;
    out << sub->get_display_name(true) << '\n';

    detail::streamOutAsParagraph(
        out, make_description(sub), description_paragraph_width_, "  ");  // Format description as paragraph

    if(sub->get_name().empty() && !sub->get_aliases().empty()) {
        detail::format_aliases(out, sub->get_aliases(), column_width_ + 2);
    }

    out << make_positionals(sub);
    out << make_groups(sub, mode);
    out << make_subcommands(sub, mode);
    detail::streamOutAsParagraph(out, make_footer(sub), footer_paragraph_width_);  // Format footer as paragraph

    out << '\n';
    return out.str();
}